

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O1

PaUtilAllocationGroup * PaUtil_CreateAllocationGroup(void)

{
  PaUtilAllocationGroupLink *block;
  PaUtilAllocationGroup *pPVar1;
  PaUtilAllocationGroupLink *in_RDX;
  
  pPVar1 = (PaUtilAllocationGroup *)0x0;
  block = AllocateLinks(0x10,(PaUtilAllocationGroupLink *)0x0,in_RDX);
  if (block != (PaUtilAllocationGroupLink *)0x0) {
    pPVar1 = (PaUtilAllocationGroup *)PaUtil_AllocateMemory(0x20);
    if (pPVar1 == (PaUtilAllocationGroup *)0x0) {
      PaUtil_FreeMemory(block);
      pPVar1 = (PaUtilAllocationGroup *)0x0;
    }
    else {
      pPVar1->linkCount = 0x10;
      pPVar1->linkBlocks = block;
      pPVar1->spareLinks = block + 1;
      pPVar1->allocations = (PaUtilAllocationGroupLink *)0x0;
    }
  }
  return pPVar1;
}

Assistant:

PaUtilAllocationGroup* PaUtil_CreateAllocationGroup( void )
{
    PaUtilAllocationGroup* result = 0;
    struct PaUtilAllocationGroupLink *links;


    links = AllocateLinks( PA_INITIAL_LINK_COUNT_, 0, 0 );
    if( links != 0 )
    {
        result = (PaUtilAllocationGroup*)PaUtil_AllocateMemory( sizeof(PaUtilAllocationGroup) );
        if( result )
        {
            result->linkCount = PA_INITIAL_LINK_COUNT_;
            result->linkBlocks = &links[0];
            result->spareLinks = &links[1];
            result->allocations = 0;
        }
        else
        {
            PaUtil_FreeMemory( links );
        }
    }

    return result;
}